

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_stream *
nghttp2_session_open_stream
          (nghttp2_session *session,int32_t stream_id,uint8_t flags,
          nghttp2_priority_spec *pri_spec_in,nghttp2_stream_state initial_state,
          void *stream_user_data)

{
  uint64_t uVar1;
  int iVar2;
  nghttp2_mem *mem_00;
  nghttp2_mem *mem;
  nghttp2_priority_spec *pri_spec;
  nghttp2_priority_spec pri_spec_default;
  int stream_alloc;
  nghttp2_stream *dep_stream;
  nghttp2_stream *stream;
  int rv;
  void *stream_user_data_local;
  nghttp2_stream_state initial_state_local;
  nghttp2_priority_spec *pri_spec_in_local;
  uint8_t flags_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  stack0xffffffffffffffb0 = (nghttp2_stream *)0x0;
  pri_spec_default.weight = 0;
  mem_00 = &session->mem;
  dep_stream = nghttp2_session_get_stream_raw(session,stream_id);
  pri_spec_in_local._3_1_ = flags;
  if ((session->opt_flags & 0x40) != 0) {
    pri_spec_in_local._3_1_ = flags | 0x40;
  }
  if (dep_stream == (nghttp2_stream *)0x0) {
    dep_stream = (nghttp2_stream *)nghttp2_mem_malloc(mem_00,0xe0);
    if (dep_stream == (nghttp2_stream *)0x0) {
      return (nghttp2_stream *)0x0;
    }
    pri_spec_default.weight = 1;
  }
  else {
    if (dep_stream->state != NGHTTP2_STREAM_IDLE) {
      __assert_fail("stream->state == NGHTTP2_STREAM_IDLE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x520,
                    "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                   );
    }
    if (((dep_stream->flags & 0x10) == 0) &&
       (iVar2 = nghttp2_stream_in_dep_tree(dep_stream), iVar2 == 0)) {
      __assert_fail("(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) || nghttp2_stream_in_dep_tree(stream)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x522,
                    "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                   );
    }
    iVar2 = nghttp2_stream_in_dep_tree(dep_stream);
    if (iVar2 != 0) {
      if ((dep_stream->flags & 0x10) != 0) {
        __assert_fail("!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x525,
                      "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                     );
      }
      nghttp2_session_detach_idle_stream(session,dep_stream);
      iVar2 = nghttp2_stream_dep_remove(dep_stream);
      if (iVar2 != 0) {
        return (nghttp2_stream *)0x0;
      }
      iVar2 = session_no_rfc7540_pri_no_fallback(session);
      if (iVar2 != 0) {
        dep_stream->flags = dep_stream->flags | 0x10;
      }
    }
  }
  iVar2 = session_no_rfc7540_pri_no_fallback(session);
  mem = (nghttp2_mem *)pri_spec_in;
  if ((iVar2 == 0) && ((session->remote_settings).no_rfc7540_priorities != 1)) {
    if (pri_spec_in->stream_id != 0) {
      register0x00000000 = nghttp2_session_get_stream_raw(session,pri_spec_in->stream_id);
      if ((register0x00000000 == (nghttp2_stream *)0x0) &&
         (iVar2 = session_detect_idle_stream(session,pri_spec_in->stream_id), iVar2 != 0)) {
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&pri_spec);
        register0x00000000 =
             nghttp2_session_open_stream
                       (session,pri_spec_in->stream_id,'\0',(nghttp2_priority_spec *)&pri_spec,
                        NGHTTP2_STREAM_IDLE,(void *)0x0);
        if (register0x00000000 == (nghttp2_stream *)0x0) {
          if (pri_spec_default.weight != 0) {
            nghttp2_mem_free(mem_00,dep_stream);
          }
          return (nghttp2_stream *)0x0;
        }
      }
      else if ((stack0xffffffffffffffb0 == (nghttp2_stream *)0x0) ||
              (iVar2 = nghttp2_stream_in_dep_tree(stack0xffffffffffffffb0), iVar2 == 0)) {
        nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&pri_spec);
        mem = (nghttp2_mem *)&pri_spec;
      }
    }
  }
  else {
    if ((session->server != '\0') || ((session->remote_settings).no_rfc7540_priorities == 1)) {
      nghttp2_priority_spec_default_init((nghttp2_priority_spec *)&pri_spec);
      mem = (nghttp2_mem *)&pri_spec;
    }
    if (session->pending_no_rfc7540_priorities == '\x01') {
      pri_spec_in_local._3_1_ = pri_spec_in_local._3_1_ | 0x10;
    }
  }
  if (initial_state == NGHTTP2_STREAM_RESERVED) {
    pri_spec_in_local._3_1_ = pri_spec_in_local._3_1_ | 1;
  }
  if (pri_spec_default.weight == 0) {
    dep_stream->flags = pri_spec_in_local._3_1_;
    dep_stream->state = initial_state;
    dep_stream->weight = *(int32_t *)((long)&mem->mem_user_data + 4);
    dep_stream->stream_user_data = stream_user_data;
  }
  else {
    nghttp2_stream_init(dep_stream,stream_id,pri_spec_in_local._3_1_,initial_state,
                        *(int32_t *)((long)&mem->mem_user_data + 4),
                        (session->remote_settings).initial_window_size,
                        (session->local_settings).initial_window_size,stream_user_data,mem_00);
    iVar2 = session_no_rfc7540_pri_no_fallback(session);
    if (iVar2 != 0) {
      uVar1 = session->stream_seq;
      session->stream_seq = uVar1 + 1;
      dep_stream->seq = uVar1;
    }
    iVar2 = nghttp2_map_insert(&session->streams,stream_id,dep_stream);
    if (iVar2 != 0) {
      nghttp2_stream_free(dep_stream);
      nghttp2_mem_free(mem_00,dep_stream);
      return (nghttp2_stream *)0x0;
    }
  }
  if (initial_state == NGHTTP2_STREAM_RESERVED) {
    iVar2 = nghttp2_session_is_my_stream_id(session,stream_id);
    if (iVar2 == 0) {
      nghttp2_stream_shutdown(dep_stream,NGHTTP2_SHUT_WR);
      session->num_incoming_reserved_streams = session->num_incoming_reserved_streams + 1;
    }
    else {
      nghttp2_stream_shutdown(dep_stream,NGHTTP2_SHUT_RD);
    }
  }
  else if (initial_state == NGHTTP2_STREAM_IDLE) {
    nghttp2_session_keep_idle_stream(session,dep_stream);
  }
  else {
    iVar2 = nghttp2_session_is_my_stream_id(session,stream_id);
    if (iVar2 == 0) {
      session->num_incoming_streams = session->num_incoming_streams + 1;
    }
    else {
      session->num_outgoing_streams = session->num_outgoing_streams + 1;
    }
  }
  if ((dep_stream->flags & 0x10) == 0) {
    if (*(int *)&mem->mem_user_data == 0) {
      register0x00000000 = &session->root;
    }
    if (stack0xffffffffffffffb0 == (nghttp2_stream *)0x0) {
      __assert_fail("dep_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x5a8,
                    "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                   );
    }
    if (*(char *)&mem->malloc == '\0') {
      nghttp2_stream_dep_add(stack0xffffffffffffffb0,dep_stream);
    }
    else {
      iVar2 = nghttp2_stream_dep_insert(stack0xffffffffffffffb0,dep_stream);
      if (iVar2 != 0) {
        return (nghttp2_stream *)0x0;
      }
    }
  }
  return dep_stream;
}

Assistant:

nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *session,
                                            int32_t stream_id, uint8_t flags,
                                            nghttp2_priority_spec *pri_spec_in,
                                            nghttp2_stream_state initial_state,
                                            void *stream_user_data) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_stream *dep_stream = NULL;
  int stream_alloc = 0;
  nghttp2_priority_spec pri_spec_default;
  nghttp2_priority_spec *pri_spec = pri_spec_in;
  nghttp2_mem *mem;

  mem = &session->mem;
  stream = nghttp2_session_get_stream_raw(session, stream_id);

  if (session->opt_flags &
      NGHTTP2_OPTMASK_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
    flags |= NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION;
  }

  if (stream) {
    assert(stream->state == NGHTTP2_STREAM_IDLE);
    assert((stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) ||
           nghttp2_stream_in_dep_tree(stream));

    if (nghttp2_stream_in_dep_tree(stream)) {
      assert(!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES));
      nghttp2_session_detach_idle_stream(session, stream);
      rv = nghttp2_stream_dep_remove(stream);
      if (rv != 0) {
        return NULL;
      }

      if (session_no_rfc7540_pri_no_fallback(session)) {
        stream->flags |= NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES;
      }
    }
  } else {
    stream = nghttp2_mem_malloc(mem, sizeof(nghttp2_stream));
    if (stream == NULL) {
      return NULL;
    }

    stream_alloc = 1;
  }

  if (session_no_rfc7540_pri_no_fallback(session) ||
      session->remote_settings.no_rfc7540_priorities == 1) {
    /* For client which has not received server
       SETTINGS_NO_RFC7540_PRIORITIES = 1, send a priority signal
       opportunistically. */
    if (session->server ||
        session->remote_settings.no_rfc7540_priorities == 1) {
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }

    if (session->pending_no_rfc7540_priorities == 1) {
      flags |= NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES;
    }
  } else if (pri_spec->stream_id != 0) {
    dep_stream = nghttp2_session_get_stream_raw(session, pri_spec->stream_id);

    if (!dep_stream &&
        session_detect_idle_stream(session, pri_spec->stream_id)) {
      /* Depends on idle stream, which does not exist in memory.
         Assign default priority for it. */
      nghttp2_priority_spec_default_init(&pri_spec_default);

      dep_stream = nghttp2_session_open_stream(
          session, pri_spec->stream_id, NGHTTP2_FLAG_NONE, &pri_spec_default,
          NGHTTP2_STREAM_IDLE, NULL);

      if (dep_stream == NULL) {
        if (stream_alloc) {
          nghttp2_mem_free(mem, stream);
        }

        return NULL;
      }
    } else if (!dep_stream || !nghttp2_stream_in_dep_tree(dep_stream)) {
      /* If dep_stream is not part of dependency tree, stream will get
         default priority.  This handles the case when
         pri_spec->stream_id == stream_id.  This happens because we
         don't check pri_spec->stream_id against new stream ID in
         nghttp2_submit_request.  This also handles the case when idle
         stream created by PRIORITY frame was opened.  Somehow we
         first remove the idle stream from dependency tree.  This is
         done to simplify code base, but ideally we should retain old
         dependency.  But I'm not sure this adds values. */
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }
  }

  if (initial_state == NGHTTP2_STREAM_RESERVED) {
    flags |= NGHTTP2_STREAM_FLAG_PUSH;
  }

  if (stream_alloc) {
    nghttp2_stream_init(stream, stream_id, flags, initial_state,
                        pri_spec->weight,
                        (int32_t)session->remote_settings.initial_window_size,
                        (int32_t)session->local_settings.initial_window_size,
                        stream_user_data, mem);

    if (session_no_rfc7540_pri_no_fallback(session)) {
      stream->seq = session->stream_seq++;
    }

    rv = nghttp2_map_insert(&session->streams, stream_id, stream);
    if (rv != 0) {
      nghttp2_stream_free(stream);
      nghttp2_mem_free(mem, stream);
      return NULL;
    }
  } else {
    stream->flags = flags;
    stream->state = initial_state;
    stream->weight = pri_spec->weight;
    stream->stream_user_data = stream_user_data;
  }

  switch (initial_state) {
  case NGHTTP2_STREAM_RESERVED:
    if (nghttp2_session_is_my_stream_id(session, stream_id)) {
      /* reserved (local) */
      nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
    } else {
      /* reserved (remote) */
      nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      ++session->num_incoming_reserved_streams;
    }
    /* Reserved stream does not count in the concurrent streams
       limit. That is one of the DOS vector. */
    break;
  case NGHTTP2_STREAM_IDLE:
    /* Idle stream does not count toward the concurrent streams limit.
       This is used as anchor node in dependency tree. */
    nghttp2_session_keep_idle_stream(session, stream);
    break;
  default:
    if (nghttp2_session_is_my_stream_id(session, stream_id)) {
      ++session->num_outgoing_streams;
    } else {
      ++session->num_incoming_streams;
    }
  }

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return stream;
  }

  if (pri_spec->stream_id == 0) {
    dep_stream = &session->root;
  }

  assert(dep_stream);

  if (pri_spec->exclusive) {
    rv = nghttp2_stream_dep_insert(dep_stream, stream);
    if (rv != 0) {
      return NULL;
    }
  } else {
    nghttp2_stream_dep_add(dep_stream, stream);
  }

  return stream;
}